

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildValue.h
# Opt level: O1

void __thiscall
llbuild::buildsystem::BuildValue::BuildValue
          (BuildValue *this,Kind kind,
          ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          values)

{
  this->kind = kind;
  *(undefined8 *)&this->numOutputInfos = 0;
  *(undefined8 *)((long)&(this->signature).value + 4) = 0;
  *(undefined8 *)((long)&(this->valueData).asOutputInfo.device + 4) = 0;
  *(undefined8 *)((long)&(this->valueData).asOutputInfo.inode + 4) = 0;
  *(undefined8 *)((long)&(this->valueData).asOutputInfo.mode + 4) = 0;
  *(undefined8 *)((long)&(this->valueData).asOutputInfo.size + 4) = 0;
  *(undefined8 *)((long)&(this->valueData).asOutputInfo.modTime.seconds + 4) = 0;
  *(undefined8 *)((long)&(this->valueData).asOutputInfo.modTime.nanoseconds + 4) = 0;
  *(undefined8 *)((long)&this->valueData + 0x34) = 0;
  *(undefined8 *)((long)&this->valueData + 0x3c) = 0;
  *(undefined8 *)((long)&this->valueData + 0x40) = 0;
  *(undefined8 *)((long)&this->valueData + 0x48) = 0;
  llbuild::basic::StringList::StringList<std::__cxx11::string>(&this->stringValues,values);
  if ((this->kind < SuccessfulCommandWithOutputSignature) &&
     ((0x10090U >> (this->kind & (FilteredDirectoryContents|Target)) & 1) != 0)) {
    return;
  }
  __assert_fail("kindHasStringList()",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llbuild/BuildSystem/BuildValue.h"
                ,0xb3,"llbuild::buildsystem::BuildValue::BuildValue(Kind, ArrayRef<std::string>)");
}

Assistant:

BuildValue(Kind kind, ArrayRef<std::string> values)
      : kind(kind), stringValues(values) {
    assert(kindHasStringList());
  }